

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

void pulse_context_destroy(cubeb_conflict *ctx)

{
  pa_operation *stream;
  cubeb_conflict *in_RDI;
  pa_operation *o;
  pa_operation *in_stack_ffffffffffffffe8;
  
  (*cubeb_pa_threaded_mainloop_lock)(in_RDI->mainloop);
  stream = (*cubeb_pa_context_drain)(in_RDI->context,context_notify_callback,in_RDI);
  if (stream != (pa_operation *)0x0) {
    operation_wait(in_RDI,(pa_stream *)stream,in_stack_ffffffffffffffe8);
    (*cubeb_pa_operation_unref)(stream);
  }
  (*cubeb_pa_context_set_state_callback)(in_RDI->context,(pa_context_notify_cb_t)0x0,(void *)0x0);
  (*cubeb_pa_context_disconnect)(in_RDI->context);
  (*cubeb_pa_context_unref)(in_RDI->context);
  (*cubeb_pa_threaded_mainloop_unlock)(in_RDI->mainloop);
  return;
}

Assistant:

static void
pulse_context_destroy(cubeb * ctx)
{
  pa_operation * o;

  WRAP(pa_threaded_mainloop_lock)(ctx->mainloop);
  o = WRAP(pa_context_drain)(ctx->context, context_notify_callback, ctx);
  if (o) {
    operation_wait(ctx, NULL, o);
    WRAP(pa_operation_unref)(o);
  }
  WRAP(pa_context_set_state_callback)(ctx->context, NULL, NULL);
  WRAP(pa_context_disconnect)(ctx->context);
  WRAP(pa_context_unref)(ctx->context);
  WRAP(pa_threaded_mainloop_unlock)(ctx->mainloop);
}